

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void oonf_stream_close_all_sessions(oonf_stream_socket *stream_socket)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  if (((stream_socket->_node).next != (list_entity *)0x0) &&
     ((stream_socket->_node).prev != (list_entity *)0x0)) {
    plVar1 = (stream_socket->session).next;
    do {
      do {
        plVar2 = plVar1;
        if (plVar2->prev == (stream_socket->session).prev) {
          return;
        }
        plVar1 = plVar2->next;
      } while ((plVar2[-0xc].next != (list_entity *)0x0) ||
              (*(char *)((long)&plVar2[0xd].prev + 2) != '\0'));
      _stream_close((oonf_stream_session *)(plVar2 + -0x16));
    } while( true );
  }
  return;
}

Assistant:

static INLINE bool
list_is_node_added(const struct list_entity *node) {
  return node->next != NULL && node->prev != NULL;
}